

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

size_t __thiscall google::protobuf::DescriptorProto::ByteSizeLong(DescriptorProto *this)

{
  RepeatedPtrField<google::protobuf::FieldDescriptorProto> *pRVar1;
  RepeatedPtrField<google::protobuf::DescriptorProto> *this_00;
  RepeatedPtrField<google::protobuf::EnumDescriptorProto> *this_01;
  RepeatedPtrField<google::protobuf::DescriptorProto_ExtensionRange> *this_02;
  RepeatedPtrField<google::protobuf::OneofDescriptorProto> *this_03;
  RepeatedPtrField<google::protobuf::DescriptorProto_ReservedRange> *this_04;
  uint uVar2;
  anon_union_224_1_493b367e_for_DescriptorProto_3 aVar3;
  void **ppvVar4;
  const_iterator cVar5;
  size_t sVar6;
  const_iterator cVar7;
  const_iterator cVar8;
  const_iterator cVar9;
  const_iterator cVar10;
  const_iterator cVar11;
  Value<google::protobuf::internal::GenericTypeHandler<std::string>_> *value;
  size_t sVar12;
  ulong uVar13;
  uint index;
  uint uVar14;
  long lVar15;
  
  lVar15 = (long)*(int *)((long)&this->field_0 + 0x10);
  pRVar1 = &(this->field_0)._impl_.field_;
  ppvVar4 = internal::RepeatedPtrFieldBase::elements(&pRVar1->super_RepeatedPtrFieldBase);
  cVar5 = RepeatedPtrField<google::protobuf::FieldDescriptorProto>::end(pRVar1);
  for (; ppvVar4 != cVar5.it_; ppvVar4 = ppvVar4 + 1) {
    sVar6 = internal::WireFormatLite::MessageSize<google::protobuf::FieldDescriptorProto>
                      ((FieldDescriptorProto *)*ppvVar4);
    lVar15 = lVar15 + sVar6;
  }
  lVar15 = lVar15 + *(int *)((long)&this->field_0 + 0x28);
  this_00 = &(this->field_0)._impl_.nested_type_;
  ppvVar4 = internal::RepeatedPtrFieldBase::elements(&this_00->super_RepeatedPtrFieldBase);
  cVar7 = RepeatedPtrField<google::protobuf::DescriptorProto>::end(this_00);
  for (; ppvVar4 != cVar7.it_; ppvVar4 = ppvVar4 + 1) {
    sVar6 = internal::WireFormatLite::MessageSize<google::protobuf::DescriptorProto>
                      ((DescriptorProto *)*ppvVar4);
    lVar15 = lVar15 + sVar6;
  }
  lVar15 = lVar15 + *(int *)((long)&this->field_0 + 0x40);
  this_01 = &(this->field_0)._impl_.enum_type_;
  ppvVar4 = internal::RepeatedPtrFieldBase::elements(&this_01->super_RepeatedPtrFieldBase);
  cVar8 = RepeatedPtrField<google::protobuf::EnumDescriptorProto>::end(this_01);
  for (; ppvVar4 != cVar8.it_; ppvVar4 = ppvVar4 + 1) {
    sVar6 = internal::WireFormatLite::MessageSize<google::protobuf::EnumDescriptorProto>
                      ((EnumDescriptorProto *)*ppvVar4);
    lVar15 = lVar15 + sVar6;
  }
  lVar15 = lVar15 + *(int *)((long)&this->field_0 + 0x58);
  this_02 = &(this->field_0)._impl_.extension_range_;
  ppvVar4 = internal::RepeatedPtrFieldBase::elements(&this_02->super_RepeatedPtrFieldBase);
  cVar9 = RepeatedPtrField<google::protobuf::DescriptorProto_ExtensionRange>::end(this_02);
  for (; ppvVar4 != cVar9.it_; ppvVar4 = ppvVar4 + 1) {
    sVar6 = internal::WireFormatLite::MessageSize<google::protobuf::DescriptorProto_ExtensionRange>
                      ((DescriptorProto_ExtensionRange *)*ppvVar4);
    lVar15 = lVar15 + sVar6;
  }
  lVar15 = lVar15 + *(int *)((long)&this->field_0 + 0x70);
  pRVar1 = &(this->field_0)._impl_.extension_;
  ppvVar4 = internal::RepeatedPtrFieldBase::elements(&pRVar1->super_RepeatedPtrFieldBase);
  cVar5 = RepeatedPtrField<google::protobuf::FieldDescriptorProto>::end(pRVar1);
  for (; ppvVar4 != cVar5.it_; ppvVar4 = ppvVar4 + 1) {
    sVar6 = internal::WireFormatLite::MessageSize<google::protobuf::FieldDescriptorProto>
                      ((FieldDescriptorProto *)*ppvVar4);
    lVar15 = lVar15 + sVar6;
  }
  lVar15 = lVar15 + *(int *)((long)&this->field_0 + 0x88);
  this_03 = &(this->field_0)._impl_.oneof_decl_;
  ppvVar4 = internal::RepeatedPtrFieldBase::elements(&this_03->super_RepeatedPtrFieldBase);
  cVar10 = RepeatedPtrField<google::protobuf::OneofDescriptorProto>::end(this_03);
  for (; ppvVar4 != cVar10.it_; ppvVar4 = ppvVar4 + 1) {
    sVar6 = internal::WireFormatLite::MessageSize<google::protobuf::OneofDescriptorProto>
                      ((OneofDescriptorProto *)*ppvVar4);
    lVar15 = lVar15 + sVar6;
  }
  lVar15 = lVar15 + *(int *)((long)&this->field_0 + 0xa0);
  this_04 = &(this->field_0)._impl_.reserved_range_;
  ppvVar4 = internal::RepeatedPtrFieldBase::elements(&this_04->super_RepeatedPtrFieldBase);
  cVar11 = RepeatedPtrField<google::protobuf::DescriptorProto_ReservedRange>::end(this_04);
  for (; ppvVar4 != cVar11.it_; ppvVar4 = ppvVar4 + 1) {
    sVar6 = internal::WireFormatLite::MessageSize<google::protobuf::DescriptorProto_ReservedRange>
                      ((DescriptorProto_ReservedRange *)*ppvVar4);
    lVar15 = lVar15 + sVar6;
  }
  uVar2 = *(uint *)((long)&this->field_0 + 0xb8);
  sVar6 = lVar15 + (ulong)uVar2;
  uVar14 = 0;
  index = 0;
  if (0 < (int)uVar2) {
    uVar14 = uVar2;
    index = 0;
  }
  for (; uVar14 != index; index = index + 1) {
    value = internal::RepeatedPtrFieldBase::
            Get<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
                      (&(this->field_0)._impl_.reserved_name_.super_RepeatedPtrFieldBase,index);
    sVar12 = internal::WireFormatLite::StringSize(value);
    sVar6 = sVar6 + sVar12;
  }
  aVar3 = this->field_0;
  if (((undefined1  [224])aVar3 & (undefined1  [224])0x7) != (undefined1  [224])0x0) {
    if (((undefined1  [224])aVar3 & (undefined1  [224])0x1) != (undefined1  [224])0x0) {
      sVar12 = internal::WireFormatLite::StringSize
                         ((string *)
                          ((ulong)(this->field_0)._impl_.name_.tagged_ptr_.ptr_ & 0xfffffffffffffffc
                          ));
      sVar6 = sVar6 + sVar12 + 1;
    }
    if (((undefined1  [224])aVar3 & (undefined1  [224])0x2) != (undefined1  [224])0x0) {
      sVar12 = internal::WireFormatLite::MessageSize<google::protobuf::MessageOptions>
                         ((this->field_0)._impl_.options_);
      sVar6 = sVar6 + sVar12 + 1;
    }
    if (((undefined1  [224])aVar3 & (undefined1  [224])0x4) != (undefined1  [224])0x0) {
      uVar13 = (long)(this->field_0)._impl_.visibility_ | 1;
      lVar15 = 0x3f;
      if (uVar13 != 0) {
        for (; uVar13 >> lVar15 == 0; lVar15 = lVar15 + -1) {
        }
      }
      sVar6 = sVar6 + ((int)lVar15 * 9 + 0x49U >> 6) + 1;
    }
  }
  sVar6 = Message::MaybeComputeUnknownFieldsSize
                    (&this->super_Message,sVar6,&(this->field_0)._impl_._cached_size_);
  return sVar6;
}

Assistant:

::size_t DescriptorProto::ByteSizeLong() const {
  const DescriptorProto& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(message_byte_size_start:google.protobuf.DescriptorProto)
  ::size_t total_size = 0;

  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void)cached_has_bits;

  ::_pbi::Prefetch5LinesFrom7Lines(&this_);
   {
    // repeated .google.protobuf.FieldDescriptorProto field = 2;
    {
      total_size += 1UL * this_._internal_field_size();
      for (const auto& msg : this_._internal_field()) {
        total_size += ::google::protobuf::internal::WireFormatLite::MessageSize(msg);
      }
    }
    // repeated .google.protobuf.DescriptorProto nested_type = 3;
    {
      total_size += 1UL * this_._internal_nested_type_size();
      for (const auto& msg : this_._internal_nested_type()) {
        total_size += ::google::protobuf::internal::WireFormatLite::MessageSize(msg);
      }
    }
    // repeated .google.protobuf.EnumDescriptorProto enum_type = 4;
    {
      total_size += 1UL * this_._internal_enum_type_size();
      for (const auto& msg : this_._internal_enum_type()) {
        total_size += ::google::protobuf::internal::WireFormatLite::MessageSize(msg);
      }
    }
    // repeated .google.protobuf.DescriptorProto.ExtensionRange extension_range = 5;
    {
      total_size += 1UL * this_._internal_extension_range_size();
      for (const auto& msg : this_._internal_extension_range()) {
        total_size += ::google::protobuf::internal::WireFormatLite::MessageSize(msg);
      }
    }
    // repeated .google.protobuf.FieldDescriptorProto extension = 6;
    {
      total_size += 1UL * this_._internal_extension_size();
      for (const auto& msg : this_._internal_extension()) {
        total_size += ::google::protobuf::internal::WireFormatLite::MessageSize(msg);
      }
    }
    // repeated .google.protobuf.OneofDescriptorProto oneof_decl = 8;
    {
      total_size += 1UL * this_._internal_oneof_decl_size();
      for (const auto& msg : this_._internal_oneof_decl()) {
        total_size += ::google::protobuf::internal::WireFormatLite::MessageSize(msg);
      }
    }
    // repeated .google.protobuf.DescriptorProto.ReservedRange reserved_range = 9;
    {
      total_size += 1UL * this_._internal_reserved_range_size();
      for (const auto& msg : this_._internal_reserved_range()) {
        total_size += ::google::protobuf::internal::WireFormatLite::MessageSize(msg);
      }
    }
    // repeated string reserved_name = 10;
    {
      total_size +=
          1 * ::google::protobuf::internal::FromIntSize(this_._internal_reserved_name().size());
      for (int i = 0, n = this_._internal_reserved_name().size(); i < n; ++i) {
        total_size += ::google::protobuf::internal::WireFormatLite::StringSize(
            this_._internal_reserved_name().Get(i));
      }
    }
  }
  cached_has_bits = this_._impl_._has_bits_[0];
  if ((cached_has_bits & 0x00000007u) != 0) {
    // optional string name = 1;
    if ((cached_has_bits & 0x00000001u) != 0) {
      total_size += 1 + ::google::protobuf::internal::WireFormatLite::StringSize(
                                      this_._internal_name());
    }
    // optional .google.protobuf.MessageOptions options = 7;
    if ((cached_has_bits & 0x00000002u) != 0) {
      total_size += 1 +
                    ::google::protobuf::internal::WireFormatLite::MessageSize(*this_._impl_.options_);
    }
    // optional .google.protobuf.SymbolVisibility visibility = 11;
    if ((cached_has_bits & 0x00000004u) != 0) {
      total_size += 1 +
                    ::_pbi::WireFormatLite::EnumSize(this_._internal_visibility());
    }
  }
  return this_.MaybeComputeUnknownFieldsSize(total_size,
                                             &this_._impl_._cached_size_);
}